

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

ValueImpl<false> * __thiscall
google::protobuf::io::Printer::ValueImpl<false>::operator=
          (ValueImpl<false> *this,ValueImpl<true> *that)

{
  variant_alternative_t<1UL,_variant<basic_string<char>,_function<bool_()>_>_> *__rhs;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if ((ValueImpl<true> *)this != that) {
    if (*(__index_type *)
         ((long)&(that->value).
                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                 .
                 super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                 .
                 super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                 .super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
                 super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
                 super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
         + 0x20) == '\0') {
      local_20._M_str =
           *(char **)&(that->value).
                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                      .
                      super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
      ;
      local_20._M_len =
           *(size_t *)
            ((long)&(that->value).
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    .
                    super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
            + 8);
      std::variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>::
      operator=((variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>
                 *)this,&local_20);
    }
    else {
      __rhs = std::get<1ul,std::__cxx11::string,std::function<bool()>>(&that->value);
      std::variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>::
      operator=((variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>
                 *)this,__rhs);
    }
    std::__cxx11::string::_M_assign((string *)&this->consume_after);
    this->consume_parens_if_empty = that->consume_parens_if_empty;
  }
  return this;
}

Assistant:

Printer::ValueImpl<owned>& Printer::ValueImpl<owned>::operator=(
    const ValueImpl<that_owned>& that) {
  // Cast to void* is required, since this and that may potentially be of
  // different types (due to the `that_owned` parameter).
  if (static_cast<const void*>(this) == static_cast<const void*>(&that)) {
    return *this;
  }

  using ThatStringType = typename ValueImpl<that_owned>::StringType;

  if (auto* str = std::get_if<ThatStringType>(&that.value)) {
    value = StringType(*str);
  } else {
    value = std::get<Callback>(that.value);
  }

  consume_after = that.consume_after;
  consume_parens_if_empty = that.consume_parens_if_empty;
  return *this;
}